

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::SeekHead::SeekHead
          (SeekHead *this,Segment *pSegment,longlong start,longlong size_,longlong element_start,
          longlong element_size)

{
  longlong element_size_local;
  longlong element_start_local;
  longlong size__local;
  longlong start_local;
  Segment *pSegment_local;
  SeekHead *this_local;
  
  this->m_pSegment = pSegment;
  this->m_start = start;
  this->m_size = size_;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  this->m_entries = (Entry *)0x0;
  this->m_entry_count = 0;
  this->m_void_elements = (VoidElement *)0x0;
  this->m_void_element_count = 0;
  return;
}

Assistant:

SeekHead::SeekHead(Segment* pSegment, long long start, long long size_,
                   long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_start(start),
      m_size(size_),
      m_element_start(element_start),
      m_element_size(element_size),
      m_entries(0),
      m_entry_count(0),
      m_void_elements(0),
      m_void_element_count(0) {}